

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O0

bool __thiscall
gss::innards::HomomorphismModel::initialise_domains
          (HomomorphismModel *this,
          vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
          *domains)

{
  bool bVar1;
  uint uVar2;
  pointer pIVar3;
  element_type *peVar4;
  reference pvVar5;
  undefined8 in_RSI;
  long in_RDI;
  bool in_stack_00000067;
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  *in_stack_00000068;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *in_stack_00000070;
  uint in_stack_0000007c;
  int in_stack_00000080;
  int in_stack_00000084;
  HomomorphismModel *in_stack_00000088;
  bool wipeout;
  HomomorphismDomain *d_2;
  iterator __end1;
  iterator __begin1;
  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  *__range1;
  uint v;
  SVOBitset dd;
  HomomorphismDomain *d_1;
  iterator __end4;
  iterator __begin4;
  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  *__range4;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  hall_rhs;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  hall_lhs;
  uint domains_union_popcount;
  HomomorphismDomain *d;
  iterator __end2;
  iterator __begin2;
  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  *__range2;
  SVOBitset domains_union;
  uint j_2;
  uint i_2;
  bool ok;
  uint j_1;
  uint i_1;
  uint j;
  SVOBitset ni;
  uint i;
  uint g_1;
  uint g;
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  targets_ndss;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  patterns_ndss;
  uint max_graphs_for_degree_things;
  uint in_stack_fffffffffffffa88;
  int in_stack_fffffffffffffa8c;
  int in_stack_fffffffffffffa90;
  int in_stack_fffffffffffffa94;
  uint in_stack_fffffffffffffa98;
  undefined2 in_stack_fffffffffffffa9c;
  undefined1 in_stack_fffffffffffffa9e;
  byte bVar6;
  undefined1 in_stack_fffffffffffffa9f;
  SVOBitset *in_stack_fffffffffffffaa0;
  SVOBitset *in_stack_fffffffffffffaa8;
  undefined7 in_stack_fffffffffffffab0;
  undefined1 in_stack_fffffffffffffab7;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  uint uVar7;
  char *in_stack_fffffffffffffac8;
  allocator<char> *__s;
  undefined4 in_stack_fffffffffffffad0;
  uint in_stack_fffffffffffffad4;
  undefined8 in_stack_fffffffffffffaf0;
  HomomorphismModel *in_stack_fffffffffffffaf8;
  undefined8 in_stack_fffffffffffffb00;
  HomomorphismModel *in_stack_fffffffffffffb08;
  reference in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  uint in_stack_fffffffffffffb8c;
  reference in_stack_fffffffffffffb90;
  uint local_3e4;
  allocator<char> local_3a1 [33];
  reference local_380;
  HomomorphismDomain *local_378;
  __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
  local_370;
  undefined8 local_368;
  uint local_334;
  reference local_280;
  HomomorphismDomain *local_278;
  __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
  local_270;
  undefined8 local_268;
  uint local_22c;
  reference local_228;
  HomomorphismDomain *local_220;
  __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
  local_218;
  undefined8 local_210;
  allocator<char> local_179 [33];
  uint local_158;
  uint local_154;
  int local_150;
  allocator<char> local_149 [36];
  byte local_125;
  uint local_124;
  uint local_120;
  int *local_118;
  int *local_110;
  uint local_108;
  uint local_104;
  RestrictRangeFunction *in_stack_ffffffffffffff70;
  Lackey *in_stack_ffffffffffffff78;
  uint local_78;
  uint local_74;
  uint local_70;
  allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_69 [48];
  allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  local_39 [29];
  uint local_1c;
  undefined8 local_18;
  byte local_1;
  
  local_18 = in_RSI;
  pIVar3 = std::
           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         *)0x1466cc);
  if (pIVar3->params->injectivity == LocallyInjective) {
    local_3e4 = 1;
  }
  else {
    local_3e4 = *(uint *)(in_RDI + 8);
  }
  local_1c = local_3e4;
  std::
  allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  ::allocator((allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
               *)0x146727);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
           (size_type)in_stack_fffffffffffffaa8,(allocator_type *)in_stack_fffffffffffffaa0);
  std::
  allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  ::~allocator(local_39);
  std::
  allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::allocator((allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>
               *)0x146777);
  std::
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::vector((vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
            *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
           (size_type)in_stack_fffffffffffffaa8,(allocator_type *)in_stack_fffffffffffffaa0);
  std::
  allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~allocator(local_69);
  pIVar3 = std::
           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         *)0x1467b0);
  bVar1 = degree_and_nds_are_preserved(pIVar3->params);
  if ((bVar1) &&
     (pIVar3 = std::
               unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             *)0x1467de), (pIVar3->params->no_nds & 1U) == 0)) {
    for (local_70 = 0; local_70 < local_1c; local_70 = local_70 + 1) {
      std::
      vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
      ::at((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
           CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
               (size_type)in_stack_fffffffffffffaa8);
      std::
      vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
      ::at((vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
           CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      std::
      vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
      ::resize((vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
               (size_type)in_stack_fffffffffffffaa8);
    }
    for (local_74 = 0; local_74 < local_1c; local_74 = local_74 + 1) {
      for (local_78 = 0; local_78 < *(uint *)(in_RDI + 0xc); local_78 = local_78 + 1) {
        pattern_graph_row((HomomorphismModel *)
                          CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                          in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88);
        SVOBitset::SVOBitset
                  ((SVOBitset *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                   (SVOBitset *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        local_104 = SVOBitset::find_first(in_stack_fffffffffffffaa8);
        while (local_104 != 0xffffffff) {
          SVOBitset::reset((SVOBitset *)
                           CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
                           (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
          std::
          vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          ::at((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          local_108 = pattern_degree((HomomorphismModel *)
                                     CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                                     in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          local_104 = SVOBitset::find_first(in_stack_fffffffffffffaa8);
        }
        std::
        vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
        ::at((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        local_110 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88))
        ;
        std::
        vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
        ::at((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        local_118 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88))
        ;
        std::
        sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::greater<int>>
                  (local_110,local_118);
        SVOBitset::~SVOBitset
                  ((SVOBitset *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
      }
    }
  }
  for (local_120 = 0; local_120 < *(uint *)(in_RDI + 0xc); local_120 = local_120 + 1) {
    in_stack_fffffffffffffb8c = local_120;
    in_stack_fffffffffffffb90 =
         std::
         vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
         ::at((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
               *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
              CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    in_stack_fffffffffffffb90->v = in_stack_fffffffffffffb8c;
    in_stack_fffffffffffffb80 =
         std::
         vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
         ::at((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
               *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
              CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    SVOBitset::reset((SVOBitset *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    for (local_124 = 0; local_124 < *(uint *)(in_RDI + 0x10); local_124 = local_124 + 1) {
      local_125 = 1;
      bVar1 = _check_label_compatibility
                        ((HomomorphismModel *)
                         CONCAT17(in_stack_fffffffffffffa9f,
                                  CONCAT16(in_stack_fffffffffffffa9e,
                                           CONCAT24(in_stack_fffffffffffffa9c,
                                                    in_stack_fffffffffffffa98))),
                         in_stack_fffffffffffffa94,in_stack_fffffffffffffa90);
      if (bVar1) {
        bVar1 = _check_loop_compatibility
                          (in_stack_fffffffffffffb08,(int)((ulong)in_stack_fffffffffffffb00 >> 0x20)
                           ,(int)in_stack_fffffffffffffb00);
        if (bVar1) {
          pIVar3 = std::
                   unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 *)0x146d0c);
          peVar4 = std::__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>::get
                             (&(pIVar3->proof).
                               super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>);
          in_stack_fffffffffffffa88 = (uint)(peVar4 != (element_type *)0x0);
          bVar1 = _check_degree_compatibility
                            (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_0000007c
                             ,in_stack_00000070,in_stack_00000068,in_stack_00000067);
          if (bVar1) {
            bVar1 = _check_clique_compatibility
                              ((HomomorphismModel *)in_stack_fffffffffffffaa8,
                               (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20),
                               (int)in_stack_fffffffffffffaa0);
            if (!bVar1) {
              local_125 = 0;
            }
          }
          else {
            local_125 = 0;
          }
        }
        else {
          local_125 = 0;
        }
      }
      else {
        local_125 = 0;
      }
      if ((local_125 & 1) != 0) {
        std::
        vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
        ::at((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        SVOBitset::set((SVOBitset *)CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
                       (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
      }
    }
    std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
    ::at((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
          *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
         CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    uVar2 = SVOBitset::count((SVOBitset *)
                             CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
    pvVar5 = std::
             vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             ::at((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                   *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                  CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    pvVar5->count = uVar2;
    pvVar5 = std::
             vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             ::at((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                   *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                  CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    if (pvVar5->count == 0) {
      pIVar3 = std::
               unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             *)0x146ec3);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pIVar3->proof);
      if (bVar1) {
        std::
        unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
        ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      *)0x146ee5);
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x146ef1);
        std::
        vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
        ::at((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                   in_stack_fffffffffffffac8,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0))
        ;
        Proof::initial_domain_is_empty
                  ((Proof *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                   in_stack_fffffffffffffa8c,(string *)0x146f79);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        std::allocator<char>::~allocator(local_149);
      }
      local_1 = 0;
      local_150 = 1;
      goto LAB_00147a5f;
    }
  }
  pIVar3 = std::
           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         *)0x14701d);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pIVar3->proof);
  if (bVar1) {
    pIVar3 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x14703f);
    bVar1 = degree_and_nds_are_preserved(pIVar3->params);
    if ((bVar1) &&
       (pIVar3 = std::
                 unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               *)0x14706d), (pIVar3->params->no_nds & 1U) == 0)) {
      for (local_154 = 0; local_154 < *(uint *)(in_RDI + 0xc); local_154 = local_154 + 1) {
        for (local_158 = 0; local_158 < *(uint *)(in_RDI + 0x10); local_158 = local_158 + 1) {
          std::
          vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
          ::at((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          bVar1 = SVOBitset::test((SVOBitset *)
                                  CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
                                  (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
          if (bVar1) {
            in_stack_fffffffffffffa88 = 0;
            bVar1 = _check_degree_compatibility
                              (in_stack_00000088,in_stack_00000084,in_stack_00000080,
                               in_stack_0000007c,in_stack_00000070,in_stack_00000068,
                               in_stack_00000067);
            if (!bVar1) {
              std::
              vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              ::at((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                    *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                   CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
              SVOBitset::reset((SVOBitset *)
                               CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
                               (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
              pvVar5 = std::
                       vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                       ::at((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                             *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                            CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
              uVar2 = pvVar5->count - 1;
              pvVar5->count = uVar2;
              if (uVar2 == 0) {
                pIVar3 = std::
                         unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                       *)0x1471e5);
                bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pIVar3->proof);
                if (bVar1) {
                  std::
                  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                *)0x147207);
                  std::
                  __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x147213);
                  std::
                  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                  ::at((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                        *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                             in_stack_fffffffffffffac8,
                             (allocator<char> *)
                             CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
                  Proof::initial_domain_is_empty
                            ((Proof *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                             in_stack_fffffffffffffa8c,(string *)0x147283);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
                  std::allocator<char>::~allocator(local_179);
                }
                local_1 = 0;
                local_150 = 1;
                goto LAB_00147a5f;
              }
            }
          }
        }
      }
    }
  }
  pIVar3 = std::
           unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         *)0x147343);
  bVar1 = is_nonshrinking(pIVar3->params);
  if (bVar1) {
    SVOBitset::SVOBitset
              (in_stack_fffffffffffffaa0,
               CONCAT13(in_stack_fffffffffffffa9f,
                        CONCAT12(in_stack_fffffffffffffa9e,in_stack_fffffffffffffa9c)),
               in_stack_fffffffffffffa98);
    local_210 = local_18;
    local_218._M_current =
         (HomomorphismDomain *)
         std::
         vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
         ::begin((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                  *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    local_220 = (HomomorphismDomain *)
                std::
                vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                ::end((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                       *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    while (bVar1 = __gnu_cxx::
                   operator==<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                             ((__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                               *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                              (__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                               *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      local_228 = __gnu_cxx::
                  __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                  ::operator*(&local_218);
      SVOBitset::operator|=
                (in_stack_fffffffffffffaa0,
                 (SVOBitset *)
                 CONCAT17(in_stack_fffffffffffffa9f,
                          CONCAT16(in_stack_fffffffffffffa9e,
                                   CONCAT24(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98))));
      __gnu_cxx::
      __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
      ::operator++(&local_218);
    }
    local_22c = SVOBitset::count((SVOBitset *)
                                 CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
    if (local_22c < *(uint *)(in_RDI + 0xc)) {
      pIVar3 = std::
               unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             *)0x14746e);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pIVar3->proof);
      if (bVar1) {
        std::
        vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x147490);
        std::
        vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x14749d);
        local_268 = local_18;
        local_270._M_current =
             (HomomorphismDomain *)
             std::
             vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             ::begin((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                      *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        local_278 = (HomomorphismDomain *)
                    std::
                    vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                    ::end((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                           *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        while (bVar1 = __gnu_cxx::
                       operator==<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                                 ((__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                                  (__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88)),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          local_280 = __gnu_cxx::
                      __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                      ::operator*(&local_270);
          pattern_vertex_for_proof_abi_cxx11_
                    (in_stack_fffffffffffffaf8,(int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push_back((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                      (value_type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x147551);
          __gnu_cxx::
          __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
          ::operator++(&local_270);
        }
        SVOBitset::SVOBitset
                  ((SVOBitset *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                   (SVOBitset *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        local_334 = SVOBitset::find_first(in_stack_fffffffffffffaa8);
        while (local_334 != 0xffffffff) {
          SVOBitset::reset((SVOBitset *)
                           CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
                           (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
          target_vertex_for_proof_abi_cxx11_
                    (in_stack_fffffffffffffaf8,(int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push_back((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                      (value_type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x14763d);
          in_stack_fffffffffffffad4 = SVOBitset::find_first(in_stack_fffffffffffffaa8);
          local_334 = in_stack_fffffffffffffad4;
        }
        std::
        unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
        ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      *)0x1476a6);
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1476b2);
        Proof::emit_hall_set_or_violator
                  ((Proof *)in_stack_fffffffffffffb90,
                   (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                   (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffb80);
        SVOBitset::~SVOBitset
                  ((SVOBitset *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        std::
        vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffaa0);
        std::
        vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffaa0);
      }
      local_1 = 0;
      local_150 = 1;
    }
    else {
      local_150 = 0;
    }
    SVOBitset::~SVOBitset
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    if (local_150 != 0) goto LAB_00147a5f;
  }
  local_368 = local_18;
  local_370._M_current =
       (HomomorphismDomain *)
       std::
       vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>::
       begin((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  local_378 = (HomomorphismDomain *)
              std::
              vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              ::end((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                     *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  while (bVar1 = __gnu_cxx::
                 operator==<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                           ((__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                            (__normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                             *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_380 = __gnu_cxx::
                __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                ::operator*(&local_370);
    uVar2 = SVOBitset::count((SVOBitset *)
                             CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0));
    local_380->count = uVar2;
    if (local_380->count == 0) {
      pIVar3 = std::
               unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                             *)0x147825);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pIVar3->proof);
      if (bVar1) {
        std::
        unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
        ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      *)0x147847);
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x147853);
        uVar7 = local_380->v;
        __s = local_3a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffad4,uVar2),(char *)__s,
                   (allocator<char> *)CONCAT44(uVar7,in_stack_fffffffffffffac0));
        Proof::initial_domain_is_empty
                  ((Proof *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                   in_stack_fffffffffffffa8c,(string *)0x1478a9);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        std::allocator<char>::~allocator(local_3a1);
        local_1 = 0;
        local_150 = 1;
        goto LAB_00147a5f;
      }
    }
    __gnu_cxx::
    __normal_iterator<gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
    ::operator++(&local_370);
  }
  std::
  unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                *)0x147947);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_> *
                     )0x147956);
  if (bVar1) {
    std::
    unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
    ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  *)0x147974);
    in_stack_fffffffffffffaa0 =
         (SVOBitset *)
         std::unique_ptr<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>::
         operator->((unique_ptr<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_> *)
                    0x147983);
    std::function<void(int,int)>::
    function<gss::innards::HomomorphismModel::initialise_domains(std::vector<gss::innards::HomomorphismDomain,std::allocator<gss::innards::HomomorphismDomain>>&)const::__0,void>
              ((function<void_(int,_int)> *)in_stack_fffffffffffffaa0,
               (anon_class_16_2_a147db41 *)
               CONCAT17(in_stack_fffffffffffffa9f,
                        CONCAT16(in_stack_fffffffffffffa9e,
                                 CONCAT24(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98))));
    bVar1 = Lackey::reduce_initial_bounds(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    bVar6 = !bVar1;
    std::function<void_(int,_int)>::~function((function<void_(int,_int)> *)0x147a08);
    if ((bVar6 & 1) != 0) {
      local_1 = 0;
      local_150 = 1;
      goto LAB_00147a5f;
    }
  }
  local_1 = 1;
  local_150 = 1;
LAB_00147a5f:
  std::
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::~vector((vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
             *)in_stack_fffffffffffffaa0);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
             *)in_stack_fffffffffffffaa0);
  return (bool)(local_1 & 1);
}

Assistant:

auto HomomorphismModel::initialise_domains(vector<HomomorphismDomain> & domains) const -> bool
{
    unsigned max_graphs_for_degree_things = (_imp->params.injectivity == Injectivity::LocallyInjective ? 1 : max_graphs);

    /* pattern and target neighbourhood degree sequences */
    vector<vector<vector<int>>> patterns_ndss(max_graphs_for_degree_things);
    vector<vector<optional<vector<int>>>> targets_ndss(max_graphs_for_degree_things);

    if (degree_and_nds_are_preserved(_imp->params) && ! _imp->params.no_nds) {
        for (unsigned g = 0; g < max_graphs_for_degree_things; ++g) {
            patterns_ndss.at(g).resize(pattern_size);
            targets_ndss.at(g).resize(target_size);
        }

        for (unsigned g = 0; g < max_graphs_for_degree_things; ++g) {
            for (unsigned i = 0; i < pattern_size; ++i) {
                auto ni = pattern_graph_row(g, i);
                for (auto j = ni.find_first(); j != decltype(ni)::npos; j = ni.find_first()) {
                    ni.reset(j);
                    patterns_ndss.at(g).at(i).push_back(pattern_degree(g, j));
                }
                sort(patterns_ndss.at(g).at(i).begin(), patterns_ndss.at(g).at(i).end(), greater<int>());
            }
        }
    }

    for (unsigned i = 0; i < pattern_size; ++i) {
        domains.at(i).v = i;
        domains.at(i).values.reset();

        for (unsigned j = 0; j < target_size; ++j) {
            bool ok = true;

            if (! _check_label_compatibility(i, j))
                ok = false;
            else if (! _check_loop_compatibility(i, j))
                ok = false;
            else if (! _check_degree_compatibility(i, j, max_graphs_for_degree_things, patterns_ndss, targets_ndss, _imp->proof.get()))
                ok = false;
            else if (! _check_clique_compatibility(i, j))
                ok = false;

            if (ok)
                domains.at(i).values.set(j);
        }

        domains.at(i).count = domains.at(i).values.count();
        if (0 == domains.at(i).count) {
            if (_imp->proof)
                _imp->proof->initial_domain_is_empty(domains.at(i).v, "compatibility stage");
            return false;
        }
    }

    // for proof logging, we need degree information before we can output nds proofs
    if (_imp->proof && degree_and_nds_are_preserved(_imp->params) && ! _imp->params.no_nds) {
        for (unsigned i = 0; i < pattern_size; ++i) {
            for (unsigned j = 0; j < target_size; ++j) {
                if (domains.at(i).values.test(j) &&
                    ! _check_degree_compatibility(i, j, max_graphs_for_degree_things, patterns_ndss, targets_ndss, false)) {
                    domains.at(i).values.reset(j);
                    if (0 == --domains.at(i).count) {
                        if (_imp->proof)
                            _imp->proof->initial_domain_is_empty(domains.at(i).v, "nds stage");
                        return false;
                    }
                }
            }
        }
    }

    // quick sanity check that we have enough values
    if (is_nonshrinking(_imp->params)) {
        SVOBitset domains_union{target_size, 0};
        for (auto & d : domains)
            domains_union |= d.values;

        unsigned domains_union_popcount = domains_union.count();
        if (domains_union_popcount < unsigned(pattern_size)) {
            if (_imp->proof) {
                vector<NamedVertex> hall_lhs, hall_rhs;
                for (auto & d : domains)
                    hall_lhs.push_back(pattern_vertex_for_proof(d.v));
                auto dd = domains_union;
                for (auto v = dd.find_first(); v != decltype(dd)::npos; v = dd.find_first()) {
                    dd.reset(v);
                    hall_rhs.push_back(target_vertex_for_proof(v));
                }
                _imp->proof->emit_hall_set_or_violator(hall_lhs, hall_rhs);
            }
            return false;
        }
    }

    for (auto & d : domains) {
        d.count = d.values.count();
        if (0 == d.count && _imp->proof) {
            _imp->proof->initial_domain_is_empty(d.v, "post-initialisation stage");
            return false;
        }
    }

    if (_imp->params.lackey) {
        // If we're dealing with a model from Essence, it's possible some values will
        // be completely eliminated from the upper and lower bounds of certain domains,
        // in which case they won't show up as being deleted during propagation.
        bool wipeout = false;
        if (! _imp->params.lackey->reduce_initial_bounds([&](int p, int t) -> void {
                for (auto & d : domains)
                    if (d.v == unsigned(p)) {
                        if (d.values.test(t)) {
                            d.values.reset(t);
                            if (0 == --d.count)
                                wipeout = true;
                        }
                        break;
                    }
            }) ||
            wipeout) {
            return false;
        }
    }

    return true;
}